

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O0

LogicalType *
duckdb::LambdaFunctions::BindBinaryLambda(idx_t parameter_idx,LogicalType *list_child_type)

{
  BinderException *this;
  LogicalType *in_RDX;
  long in_RSI;
  LogicalType *in_RDI;
  allocator local_39;
  string local_38 [56];
  
  if (in_RSI == 0) {
    duckdb::LogicalType::LogicalType(in_RDI,in_RDX);
  }
  else {
    if (in_RSI != 1) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"This lambda function only supports up to two lambda parameters!",
                 &local_39);
      duckdb::BinderException::BinderException(this,local_38);
      __cxa_throw(this,&BinderException::typeinfo,BinderException::~BinderException);
    }
    duckdb::LogicalType::LogicalType(in_RDI,BIGINT);
  }
  return in_RDI;
}

Assistant:

LogicalType LambdaFunctions::BindBinaryLambda(const idx_t parameter_idx, const LogicalType &list_child_type) {
	switch (parameter_idx) {
	case 0:
		return list_child_type;
	case 1:
		return LogicalType::BIGINT;
	default:
		throw BinderException("This lambda function only supports up to two lambda parameters!");
	}
}